

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::ImageStoreTestInstance
          (ImageStoreTestInstance *this,Context *context,Texture *texture,VkFormat format,
          bool declareImageFormatInShader,bool singleLayerBind)

{
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data_00;
  Allocator *pAVar1;
  Allocator *pAVar2;
  int iVar3;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkDeviceSize VVar4;
  Image *this_00;
  Buffer *pBVar5;
  Allocation *this_01;
  void *pvVar6;
  void *ptr;
  VkDeviceMemory memory;
  Buffer *in_stack_fffffffffffffd98;
  VkDevice pVVar7;
  undefined8 in_stack_fffffffffffffda0;
  VkDevice device_00;
  deUint32 *valuePtr;
  int layerNdx;
  deUint8 *basePtr;
  Allocation *alloc;
  VkBufferCreateInfo local_138;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_100;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_f0;
  VkDeviceSize local_e0;
  VkDeviceSize constantsBufferSizeBytes;
  DefaultDeleter<vkt::image::Image> local_cd;
  int numLayers;
  VkImageCreateInfo local_c8;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> local_70;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_60;
  Allocator *local_50;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  undefined1 local_26;
  undefined1 local_25;
  VkFormat local_24;
  bool singleLayerBind_local;
  bool declareImageFormatInShader_local;
  Texture *pTStack_20;
  VkFormat format_local;
  Texture *texture_local;
  Context *context_local;
  ImageStoreTestInstance *this_local;
  
  local_26 = singleLayerBind;
  local_25 = declareImageFormatInShader;
  local_24 = format;
  pTStack_20 = texture;
  texture_local = (Texture *)context;
  context_local = (Context *)this;
  StoreTestInstance::StoreTestInstance
            (&this->super_StoreTestInstance,context,texture,format,declareImageFormatInShader,
             singleLayerBind);
  (this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ImageStoreTestInstance_0166bf00;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            (&this->m_image);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            (&this->m_constantsBuffer);
  vki = Context::getInstanceInterface((Context *)texture_local);
  physDevice = Context::getPhysicalDevice((Context *)texture_local);
  VVar4 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
  this->m_constantsBufferChunkSizeBytes = VVar4;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  iVar3 = Texture::numLayers(pTStack_20);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
            ((long)&vk + 3));
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&this->m_allDescriptorSets,(long)iVar3,
           (allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
           ((long)&vk + 3));
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>::
  ~allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_> *)
             ((long)&vk + 3));
  iVar3 = Texture::numLayers(pTStack_20);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>::
  allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
            ((long)&vk + 2));
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->m_allImageViews,(long)iVar3,
           (allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
           ((long)&vk + 2));
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>::
  ~allocator((allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_> *)
             ((long)&vk + 2));
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  allocator = (Allocator *)
              Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                                 super_TestInstance.m_context);
  local_50 = Context::getDefaultAllocator
                       ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                        m_context);
  this_00 = (Image *)operator_new(0x30);
  pVVar7 = device;
  pAVar2 = allocator;
  pAVar1 = local_50;
  image::makeImageCreateInfo
            (&local_c8,&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture,
             (this->super_StoreTestInstance).super_BaseTestInstance.m_format,9,0);
  numLayers = ::vk::MemoryRequirement::Any.m_flags;
  image::Image::Image(this_00,(DeviceInterface *)pVVar7,(VkDevice)pAVar2,pAVar1,&local_c8,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter(&local_cd);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_70);
  local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,(MovePtr *)this_00);
  data._8_8_ = in_stack_fffffffffffffda0;
  data.ptr = (Image *)in_stack_fffffffffffffd98;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::operator=
            (&this->m_image,data);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_70);
  constantsBufferSizeBytes._4_4_ =
       Texture::numLayers(&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture);
  local_e0 = (long)constantsBufferSizeBytes._4_4_ * this->m_constantsBufferChunkSizeBytes;
  pBVar5 = (Buffer *)operator_new(0x30);
  pVVar7 = device;
  pAVar2 = allocator;
  pAVar1 = local_50;
  makeBufferCreateInfo(&local_138,local_e0,0x10);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (pBVar5,(DeviceInterface *)pVVar7,(VkDevice)pAVar2,pAVar1,&local_138,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Buffer> *)((long)&alloc + 3));
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_100);
  local_f0 = de::details::MovePtr::operator_cast_to_PtrData(&local_100,(MovePtr *)pBVar5);
  data_00._8_8_ = in_stack_fffffffffffffda0;
  data_00.ptr = in_stack_fffffffffffffd98;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&this->m_constantsBuffer,data_00);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_100);
  pBVar5 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
           operator->(&(this->m_constantsBuffer).
                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                     );
  this_01 = image::Buffer::getAllocation(pBVar5);
  pvVar6 = ::vk::Allocation::getHostPtr(this_01);
  ptr = ::vk::Allocation::getHostPtr(this_01);
  ::deMemset(ptr,0,local_e0);
  for (valuePtr._4_4_ = 0; valuePtr._4_4_ < constantsBufferSizeBytes._4_4_;
      valuePtr._4_4_ = valuePtr._4_4_ + 1) {
    *(int *)((long)pvVar6 + (long)valuePtr._4_4_ * this->m_constantsBufferChunkSizeBytes) =
         valuePtr._4_4_;
  }
  pVVar7 = device;
  device_00 = (VkDevice)allocator;
  memory = ::vk::Allocation::getMemory(this_01);
  VVar4 = ::vk::Allocation::getOffset(this_01);
  ::vk::flushMappedMemoryRange((DeviceInterface *)pVVar7,device_00,memory,VVar4,local_e0);
  return;
}

Assistant:

ImageStoreTestInstance::ImageStoreTestInstance (Context&		context,
												const Texture&	texture,
												const VkFormat	format,
												const bool		declareImageFormatInShader,
												const bool		singleLayerBind)
	: StoreTestInstance					(context, texture, format, declareImageFormatInShader, singleLayerBind)
	, m_constantsBufferChunkSizeBytes	(getOptimalUniformBufferChunkSize(context.getInstanceInterface(), context.getPhysicalDevice(), sizeof(deUint32)))
	, m_allDescriptorSets				(texture.numLayers())
	, m_allImageViews					(texture.numLayers())
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	m_image = de::MovePtr<Image>(new Image(
		vk, device, allocator,
		makeImageCreateInfo(m_texture, m_format, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 0u),
		MemoryRequirement::Any));

	// This buffer will be used to pass constants to the shader

	const int numLayers = m_texture.numLayers();
	const VkDeviceSize constantsBufferSizeBytes = numLayers * m_constantsBufferChunkSizeBytes;
	m_constantsBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(constantsBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT),
		MemoryRequirement::HostVisible));

	{
		const Allocation& alloc = m_constantsBuffer->getAllocation();
		deUint8* const basePtr = static_cast<deUint8*>(alloc.getHostPtr());

		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(constantsBufferSizeBytes));

		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			deUint32* valuePtr = reinterpret_cast<deUint32*>(basePtr + layerNdx * m_constantsBufferChunkSizeBytes);
			*valuePtr = static_cast<deUint32>(layerNdx);
		}

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), constantsBufferSizeBytes);
	}
}